

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_define_foreign_param_aux
               (sexp ctx,sexp env,char *name,int num_args,char *fname,sexp_proc1 f,char *param)

{
  sexp ctx_00;
  sexp psVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp unaff_retaddr;
  sexp_sint_t in_stack_00000008;
  sexp_proc1 in_stack_00000010;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp res;
  sexp in_stack_ffffffffffffffa8;
  sexp env_00;
  undefined8 local_38;
  undefined4 in_stack_ffffffffffffffe0;
  
  local_38 = &DAT_0000003e;
  memset(&stack0xffffffffffffffb0,0,0x10);
  psVar1 = (sexp)&stack0xffffffffffffffc0;
  env_00 = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb0;
  ctx_00 = sexp_intern((sexp)__sexp_gc_preserver1.var,(char *)in_stack_00000010,in_stack_00000008);
  psVar1 = sexp_env_ref(ctx_00,env_00,psVar1,in_stack_ffffffffffffffa8);
  if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x1b)) {
    local_38 = sexp_define_foreign_aux
                         (unaff_retaddr,(sexp)in_RDI,(char *)in_RSI,(int)((ulong)in_RDX >> 0x20),
                          (int)in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                          in_stack_00000010,(sexp)__sexp_gc_preserver1.var);
  }
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)env_00;
  return (sexp)local_38;
}

Assistant:

sexp sexp_define_foreign_param_aux (sexp ctx, sexp env, const char *name,
                                    int num_args, const char *fname, sexp_proc1 f, const char *param) {
  sexp res = SEXP_FALSE;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  tmp = sexp_intern(ctx, param, -1);
  tmp = sexp_env_ref(ctx, env, tmp, SEXP_FALSE);
  if (sexp_opcodep(tmp))
    res = sexp_define_foreign_aux(ctx, env, name, num_args, 3, fname, f, tmp);
  sexp_gc_release1(ctx);
  return res;
}